

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O2

IShader * __thiscall
Diligent::SerializedShaderImpl::GetDeviceShader(SerializedShaderImpl *this,RENDER_DEVICE_TYPE Type)

{
  _Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false> _Var1;
  DeviceType DVar2;
  int iVar3;
  undefined4 extraout_var;
  
  DVar2 = RenderDeviceTypeToArchiveDeviceType(Type);
  _Var1._M_head_impl =
       (this->m_Shaders)._M_elems[DVar2]._M_t.
       super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
       ._M_t.
       super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
       .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (CompiledShader *)0x0) {
    iVar3 = (*(_Var1._M_head_impl)->_vptr_CompiledShader[3])();
    return (IShader *)CONCAT44(extraout_var,iVar3);
  }
  return (IShader *)0x0;
}

Assistant:

IShader* SerializedShaderImpl::GetDeviceShader(RENDER_DEVICE_TYPE Type) const
{
    const DeviceType ArchiveDeviceType = RenderDeviceTypeToArchiveDeviceType(Type);
    const auto&      pCompiledShader   = m_Shaders[static_cast<size_t>(ArchiveDeviceType)];
    return pCompiledShader ?
        pCompiledShader->GetDeviceShader() :
        nullptr;
}